

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.h
# Opt level: O1

void __thiscall
density::detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::
deallocate_page<(density::detail::page_allocation_type)1>
          (PageAllocator<density::detail::SystemPageManager<65536UL>_> *this,void *i_page)

{
  WF_PageStack *pWVar1;
  PageAllocatorSlot *pPVar2;
  PageAllocatorSlot *pPVar3;
  PageFooter *pPVar4;
  uintptr_t uint_pointer;
  PageFooter *i_page_00;
  bool bVar5;
  
  if ((this->m_pages_to_unpin).m_first != (PageFooter *)0x0) {
    process_pending_unpins_impl(progress_wait_free);
  }
  i_page_00 = (PageFooter *)((ulong)i_page & 0xffffffffffff0000 | 0xfff0);
  pPVar2 = this->m_current_slot;
  while( true ) {
    pPVar3 = this->m_current_slot;
    pPVar4 = (pPVar3->m_zeroed_page_stack).m_first._M_b._M_p;
    if (pPVar4 == (PageFooter *)0x1) {
      bVar5 = false;
    }
    else {
      i_page_00->m_next_page = pPVar4;
      pWVar1 = &pPVar3->m_zeroed_page_stack;
      LOCK();
      bVar5 = pPVar4 == (pWVar1->m_first)._M_b._M_p;
      if (bVar5) {
        (pWVar1->m_first)._M_b._M_p = i_page_00;
      }
      UNLOCK();
    }
    if (bVar5) break;
    pPVar3 = (this->m_current_slot->m_next_slot)._M_b._M_p;
    this->m_current_slot = pPVar3;
    if (pPVar2 == pPVar3) {
      PageStack::push(&this->m_private_zeroed_page_stack,i_page_00);
      return;
    }
  }
  return;
}

Assistant:

void deallocate_page(void * i_page) noexcept
            {
                process_pending_unpins(progress_wait_free);

                auto const page = get_footer(i_page);

                // try to push the page once on every slot
                auto * const original_slot = m_current_slot;
                bool         done          = false;
                do
                {

                    if (m_current_slot->get_stack(ALLOCATION_TYPE).try_push(page))
                    {
                        done = true;
                        break;
                    }

                    m_current_slot = m_current_slot->m_next_slot.load();
                } while (m_current_slot != original_slot);

                // this is unlikely, but it may happen
                if (!done)
                {
                    get_private_stack(ALLOCATION_TYPE).push(page);
                }
            }